

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis2.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  time_t tVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_78 = 0.0;
  uStack_70 = 0.0;
  uVar4 = 1;
  iVar5 = 0;
  local_80 = 1.0;
  iVar6 = 0;
  while( true ) {
    if (iVar5 == -10000) break;
    iVar1 = rand();
    iVar2 = rand();
    auVar13._0_8_ = (double)iVar2;
    auVar13._8_8_ = (double)iVar1;
    auVar13 = divpd(auVar13,_DAT_00102020);
    dVar11 = (auVar13._0_8_ + -0.5) * 0.5;
    dVar14 = (auVar13._8_8_ + -0.5) * 0.5;
    dVar12 = dVar11 + dVar11 + local_78;
    dVar14 = dVar14 + dVar14 + uStack_70;
    iVar1 = rand();
    dVar11 = exp((uStack_70 * local_78 + uStack_70 * uStack_70 + local_78 * local_78) * 0.5 -
                 (dVar14 * dVar12 + dVar14 * dVar14 + dVar12 * dVar12) * 0.5);
    uVar10 = (uint)((double)iVar1 / 2147483647.0 < dVar11);
    iVar6 = iVar6 + uVar10;
    uVar7 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
    local_48 = SUB84(dVar12,0);
    uStack_44 = (uint)((ulong)dVar12 >> 0x20);
    uStack_40 = SUB84(dVar14,0);
    uStack_3c = (uint)((ulong)dVar14 >> 0x20);
    local_78 = (double)CONCAT44(~uVar8 & local_78._4_4_ | uStack_44 & uVar8,
                                ~uVar7 & (uint)local_78 | local_48 & uVar7);
    uStack_70 = (double)CONCAT44(~uVar10 & uStack_70._4_4_ | uStack_3c & uVar10,
                                 ~uVar9 & (uint)uStack_70 | uStack_40 & uVar9);
    if ((ushort)((uVar4 / 10) * -10 + 1) == (short)iVar5) {
      printf("%.10f\t%.10f\t%f\n",uStack_70,local_78,(double)iVar6 / local_80);
    }
    local_80 = local_80 + 1.0;
    iVar5 = iVar5 + -1;
    uVar4 = uVar4 + 1;
  }
  return 0;
}

Assistant:

int main(void) {
    int niter = 10000; // サンプルの数
    double step_size_x = 0.5e0;
    double step_size_y = 0.5e0;

    srand((unsigned) time(nullptr));

    double x = 0e0;
    double y = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double backup_y = y;
        double action_init = 0.5e0 * (x * x + y * y + x * y);

        double dx = (double) rand() / RAND_MAX;
        double dy = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size_x * 2e0;
        dy = (dy - 0.5e0) * step_size_y * 2e0;
        x += dx;
        y += dy;

        double action_fin = 0.5e0 * (x * x + y * y + x * y);

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
            y = backup_y;
        }
        if (iter % 10 == 0) {
            printf("%.10f\t%.10f\t%f\n", x, y, (double) naccept / iter);
        }
    }
}